

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall gflags::anon_unknown_2::FlagValue::~FlagValue(FlagValue *this)

{
  string *this_00;
  FlagValue *this_local;
  
  if ((this->owns_value_ & 1U) != 0) {
    switch(this->type_) {
    case '\0':
      if (this->value_buffer_ != (void *)0x0) {
        operator_delete(this->value_buffer_);
      }
      break;
    case '\x01':
      if (this->value_buffer_ != (void *)0x0) {
        operator_delete(this->value_buffer_);
      }
      break;
    case '\x02':
      if (this->value_buffer_ != (void *)0x0) {
        operator_delete(this->value_buffer_);
      }
      break;
    case '\x03':
      if (this->value_buffer_ != (void *)0x0) {
        operator_delete(this->value_buffer_);
      }
      break;
    case '\x04':
      if (this->value_buffer_ != (void *)0x0) {
        operator_delete(this->value_buffer_);
      }
      break;
    case '\x05':
      if (this->value_buffer_ != (void *)0x0) {
        operator_delete(this->value_buffer_);
      }
      break;
    case '\x06':
      this_00 = (string *)this->value_buffer_;
      if (this_00 != (string *)0x0) {
        std::__cxx11::string::~string(this_00);
        operator_delete(this_00);
      }
    }
  }
  return;
}

Assistant:

FlagValue::~FlagValue() {
  if (!owns_value_) {
    return;
  }
  switch (type_) {
    case FV_BOOL: delete reinterpret_cast<bool*>(value_buffer_); break;
    case FV_INT32: delete reinterpret_cast<int32*>(value_buffer_); break;
    case FV_UINT32: delete reinterpret_cast<uint32*>(value_buffer_); break;
    case FV_INT64: delete reinterpret_cast<int64*>(value_buffer_); break;
    case FV_UINT64: delete reinterpret_cast<uint64*>(value_buffer_); break;
    case FV_DOUBLE: delete reinterpret_cast<double*>(value_buffer_); break;
    case FV_STRING: delete reinterpret_cast<string*>(value_buffer_); break;
  }
}